

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QSize __thiscall QToolBarAreaLayoutLine::sizeHint(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  QToolBarAreaLayoutItem *pQVar1;
  QLayoutItem *pQVar2;
  QSize QVar3;
  int iVar4;
  QSize QVar5;
  uint uVar6;
  Representation RVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  
  if ((this->toolBarItems).d.size == 0) {
    uVar6 = 0;
    uVar8 = 0;
  }
  else {
    lVar9 = 0;
    uVar10 = 0;
    uVar8 = 0;
    uVar6 = 0;
    do {
      pQVar1 = (this->toolBarItems).d.ptr;
      this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar1->widgetItem + lVar9);
      RVar7.m_i = uVar6;
      if (((&pQVar1->gap)[lVar9] != false) ||
         ((pQVar2 = this_00->widgetItem, pQVar2 != (QLayoutItem *)0x0 &&
          (iVar4 = (*pQVar2->_vptr_QLayoutItem[8])(), (char)iVar4 == '\0')))) {
        QVar5 = QToolBarAreaLayoutItem::sizeHint(this_00);
        QVar3 = (QSize)((ulong)QVar5 >> 0x20);
        if (this->o == Horizontal) {
          QVar3 = QVar5;
        }
        iVar4 = *(int *)((long)&pQVar1->preferredSize + lVar9);
        RVar7.m_i = QVar3.wd.m_i.m_i;
        if (0 < iVar4) {
          RVar7.m_i = iVar4;
        }
        uVar8 = uVar8 + RVar7.m_i;
        RVar7 = QVar5.ht.m_i;
        if (this->o == Vertical) {
          RVar7 = QVar5.wd.m_i;
        }
        if (RVar7.m_i < (int)uVar6) {
          RVar7.m_i = uVar6;
        }
      }
      uVar6 = RVar7.m_i;
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + 0x18;
    } while (uVar10 < (ulong)(this->toolBarItems).d.size);
  }
  uVar10 = 0xffffffff;
  if (this->o == Horizontal) {
    uVar10 = (ulong)uVar8;
  }
  if (this->o == Vertical) {
    uVar10 = (ulong)uVar6;
    uVar6 = uVar8;
  }
  return (QSize)(uVar10 | (ulong)uVar6 << 0x20);
}

Assistant:

QSize QToolBarAreaLayoutLine::sizeHint() const
{
    int a = 0, b = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        const QToolBarAreaLayoutItem &item = toolBarItems.at(i);
        if (item.skip())
            continue;

        QSize sh = item.sizeHint();
        a += item.preferredSize > 0 ? item.preferredSize : pick(o, sh);
        b = qMax(b, perp(o, sh));
    }

    QSize result;
    rpick(o, result) = a;
    rperp(o, result) = b;

    return result;
}